

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape-description.cpp
# Opt level: O0

bool msdfgen::writeShapeDescription(FILE *output,Shape *shape)

{
  bool bVar1;
  pointer pCVar2;
  reference pEVar3;
  EdgeSegment *pEVar4;
  FILE *pFVar5;
  char *pcVar6;
  long local_f8;
  long local_e8;
  long local_d8;
  CubicSegment *e_2;
  QuadraticSegment *e_1;
  LinearSegment *e;
  const_iterator cStack_40;
  char colorCode;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_38;
  const_iterator edge;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_28;
  const_iterator contour;
  Shape *shape_local;
  FILE *output_local;
  
  contour._M_current = (Contour *)shape;
  bVar1 = Shape::validate(shape);
  if (bVar1) {
    if (((ulong)contour._M_current[1].edges.
                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                _M_impl.super__Vector_impl_data._M_start & 1) != 0) {
      fprintf((FILE *)output,"@invert-y\n");
    }
    local_28._M_current =
         (Contour *)
         std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin
                   ((vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_> *)
                    contour._M_current);
    while( true ) {
      edge._M_current =
           (EdgeHolder *)
           std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end
                     ((vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_> *)
                      contour._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                          *)&edge);
      if (!bVar1) break;
      fprintf((FILE *)output,"{\n");
      pCVar2 = __gnu_cxx::
               __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
               ::operator->(&local_28);
      bVar1 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::empty
                        (&pCVar2->edges);
      if (!bVar1) {
        pCVar2 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_28);
        local_38._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&pCVar2->edges);
        while( true ) {
          pCVar2 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_28);
          cStack_40 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::end
                                (&pCVar2->edges);
          bVar1 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffc0);
          if (!bVar1) break;
          e._7_1_ = '\0';
          pEVar3 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_38);
          pEVar4 = EdgeHolder::operator->(pEVar3);
          switch(pEVar4->color) {
          case YELLOW:
            e._7_1_ = 'y';
            break;
          default:
            break;
          case MAGENTA:
            e._7_1_ = 'm';
            break;
          case CYAN:
            e._7_1_ = 'c';
            break;
          case WHITE:
            e._7_1_ = 'w';
          }
          pEVar3 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_38);
          pEVar4 = EdgeHolder::operator*(pEVar3);
          if (pEVar4 == (EdgeSegment *)0x0) {
            local_d8 = 0;
          }
          else {
            local_d8 = __dynamic_cast(pEVar4,&EdgeSegment::typeinfo,&LinearSegment::typeinfo,0);
          }
          if (local_d8 != 0) {
            pFVar5 = (FILE *)0x21252a;
            fprintf((FILE *)output,"\t");
            writeCoord((msdfgen *)output,pFVar5,*(Point2 *)(local_d8 + 0x10));
            fprintf((FILE *)output,";\n");
            if (e._7_1_ != '\0') {
              fprintf((FILE *)output,"\t\t%c;\n",(ulong)(uint)(int)e._7_1_);
            }
          }
          pEVar3 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_38);
          pEVar4 = EdgeHolder::operator*(pEVar3);
          if (pEVar4 == (EdgeSegment *)0x0) {
            local_e8 = 0;
          }
          else {
            local_e8 = __dynamic_cast(pEVar4,&EdgeSegment::typeinfo,&QuadraticSegment::typeinfo,0);
          }
          if (local_e8 != 0) {
            pFVar5 = (FILE *)0x21252a;
            fprintf((FILE *)output,"\t");
            writeCoord((msdfgen *)output,pFVar5,*(Point2 *)(local_e8 + 0x10));
            fprintf((FILE *)output,";\n\t\t");
            if (e._7_1_ != '\0') {
              fprintf((FILE *)output,"%c",(ulong)(uint)(int)e._7_1_);
            }
            pcVar6 = "(";
            fprintf((FILE *)output,"(");
            writeCoord((msdfgen *)output,(FILE *)pcVar6,*(Point2 *)(local_e8 + 0x20));
            fprintf((FILE *)output,");\n");
          }
          pEVar3 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                   ::operator*(&local_38);
          pEVar4 = EdgeHolder::operator*(pEVar3);
          if (pEVar4 == (EdgeSegment *)0x0) {
            local_f8 = 0;
          }
          else {
            local_f8 = __dynamic_cast(pEVar4,&EdgeSegment::typeinfo,&CubicSegment::typeinfo,0);
          }
          if (local_f8 != 0) {
            pFVar5 = (FILE *)0x21252a;
            fprintf((FILE *)output,"\t");
            writeCoord((msdfgen *)output,pFVar5,*(Point2 *)(local_f8 + 0x10));
            fprintf((FILE *)output,";\n\t\t");
            if (e._7_1_ != '\0') {
              fprintf((FILE *)output,"%c",(ulong)(uint)(int)e._7_1_);
            }
            pcVar6 = "(";
            fprintf((FILE *)output,"(");
            writeCoord((msdfgen *)output,(FILE *)pcVar6,*(Point2 *)(local_f8 + 0x20));
            pcVar6 = "; ";
            fprintf((FILE *)output,"; ");
            writeCoord((msdfgen *)output,(FILE *)pcVar6,*(Point2 *)(local_f8 + 0x30));
            fprintf((FILE *)output,");\n");
          }
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_38);
        }
        fprintf((FILE *)output,"\t#\n");
      }
      fprintf((FILE *)output,"}\n");
      __gnu_cxx::
      __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
      ::operator++(&local_28);
    }
    output_local._7_1_ = true;
  }
  else {
    output_local._7_1_ = false;
  }
  return output_local._7_1_;
}

Assistant:

bool writeShapeDescription(FILE *output, const Shape &shape) {
    if (!shape.validate())
        return false;
    if (shape.inverseYAxis)
        fprintf(output, "@invert-y\n");
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        fprintf(output, "{\n");
        if (!contour->edges.empty()) {
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                char colorCode = '\0';
                switch ((*edge)->color) {
                    case YELLOW: colorCode = 'y'; break;
                    case MAGENTA: colorCode = 'm'; break;
                    case CYAN: colorCode = 'c'; break;
                    case WHITE: colorCode = 'w'; break;
                    default: break;
                }
                {
                    const LinearSegment *e = dynamic_cast<const LinearSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n");
                        if (colorCode)
                            fprintf(output, "\t\t%c;\n", colorCode);
                    }
                }
                {
                    const QuadraticSegment *e = dynamic_cast<const QuadraticSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, ");\n");
                    }
                }
                {
                    const CubicSegment *e = dynamic_cast<const CubicSegment *>(&**edge);
                    if (e) {
                        fprintf(output, "\t");
                        writeCoord(output, e->p[0]);
                        fprintf(output, ";\n\t\t");
                        if (colorCode)
                            fprintf(output, "%c", colorCode);
                        fprintf(output, "(");
                        writeCoord(output, e->p[1]);
                        fprintf(output, "; ");
                        writeCoord(output, e->p[2]);
                        fprintf(output, ");\n");
                    }
                }
            }
            fprintf(output, "\t#\n");
        }
        fprintf(output, "}\n");
    }
    return true;
}